

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean arti_reflects(obj *obj)

{
  artifact *local_28;
  artifact *arti;
  obj *obj_local;
  
  if ((obj == (obj *)0x0) || (obj->oartifact == '\0')) {
    local_28 = (artifact *)0x0;
  }
  else {
    local_28 = artilist + (int)obj->oartifact;
  }
  if (local_28 != (artifact *)0x0) {
    if (((obj->owornmask & 0xffffefffU) != 0) && ((local_28->spfx & 0x4000000) != 0)) {
      return '\x01';
    }
    if ((local_28->cspfx & 0x4000000) != 0) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean arti_reflects(struct obj *obj)
{
    const struct artifact *arti = get_artifact(obj);

    if (arti) {      
	/* while being worn */
	if ((obj->owornmask & ~W_ART) && (arti->spfx & SPFX_REFLECT))
	    return TRUE;
	/* just being carried */
	if (arti->cspfx & SPFX_REFLECT) return TRUE;
    }
    return FALSE;
}